

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_comm_connect_
               (char *port_name,MPIABI_Fint *info,MPIABI_Fint *root,MPIABI_Fint *comm,
               MPIABI_Fint *newcomm,MPIABI_Fint *ierror,size_t port_name_len)

{
  mpi_comm_connect_();
  return;
}

Assistant:

void mpiabi_comm_connect_(
  const char * port_name,
  const MPIABI_Fint * info,
  const MPIABI_Fint * root,
  const MPIABI_Fint * comm,
  MPIABI_Fint * newcomm,
  MPIABI_Fint * ierror,
  size_t port_name_len
) {
  return mpi_comm_connect_(
    port_name,
    info,
    root,
    comm,
    newcomm,
    ierror,
    port_name_len
  );
}